

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase312::run(TestCase312 *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  AsyncIoProvider *pAVar4;
  undefined4 extraout_var;
  NetworkAddress *pNVar5;
  RefOrVoid<kj::ConnectionReceiver> pCVar6;
  undefined4 extraout_var_00;
  ConnectionReceiver *pCVar7;
  RefOrVoid<kj::AsyncIoStream> connection_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  char *pcVar8;
  ArrayPtr<const_char> AVar9;
  int local_410;
  bool local_409;
  undefined1 auStack_408 [7];
  bool _kj_shouldLog_2;
  size_t local_400;
  bool local_3f1;
  undefined1 auStack_3f0 [7];
  bool _kj_shouldLog_1;
  size_t local_3e8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_3e0;
  undefined1 local_3a8 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  undefined1 local_360 [7];
  bool _kj_shouldLog;
  undefined1 local_348 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  undefined1 local_300 [8];
  Client cap;
  TwoPartyClient client;
  undefined1 local_148 [8];
  Own<kj::AsyncIoStream> connection;
  char *local_130;
  Promise<kj::Own<kj::NetworkAddress>_> local_128;
  Own<kj::NetworkAddress> local_118;
  undefined1 local_108 [8];
  Promise<void> listenPromise;
  Own<kj::ConnectionReceiver> listener;
  Task *local_e0;
  Promise<kj::Own<kj::NetworkAddress>_> local_d8;
  undefined1 local_c8 [8];
  Own<kj::NetworkAddress> address;
  Own<capnp::_::TestInterfaceImpl> local_a8;
  Client local_98;
  undefined1 local_88 [8];
  TwoPartyServer server;
  undefined1 local_40 [4];
  int callCount;
  AsyncIoContext ioContext;
  TestCase312 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  server.tasks.emptyFulfiller.ptr.ptr._4_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)&local_a8,(int *)((long)&server.tasks.emptyFulfiller.ptr.ptr + 4));
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>(&local_98,&local_a8);
  TwoPartyServer::TwoPartyServer((TwoPartyServer *)local_88,&local_98);
  Capability::Client::~Client(&local_98);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own(&local_a8);
  pAVar4 = kj::Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar4->_vptr_AsyncIoProvider[3])();
  kj::StringPtr::StringPtr((StringPtr *)&listener.ptr,"127.0.0.1");
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&local_d8,(undefined8 *)CONCAT44(extraout_var,iVar2),listener.ptr,local_e0,0);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)local_c8,&local_d8);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_d8);
  pNVar5 = kj::Own<kj::NetworkAddress>::operator->((Own<kj::NetworkAddress> *)local_c8);
  (*pNVar5->_vptr_NetworkAddress[1])(&listenPromise.super_PromiseBase.node.ptr);
  pCVar6 = kj::Own<kj::ConnectionReceiver>::operator*
                     ((Own<kj::ConnectionReceiver> *)&listenPromise.super_PromiseBase.node.ptr);
  TwoPartyServer::listen((TwoPartyServer *)local_108,(int)local_88,(int)pCVar6);
  pAVar4 = kj::Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar4->_vptr_AsyncIoProvider[3])();
  kj::StringPtr::StringPtr((StringPtr *)&connection.ptr,"127.0.0.1");
  pCVar7 = kj::Own<kj::ConnectionReceiver>::operator->
                     ((Own<kj::ConnectionReceiver> *)&listenPromise.super_PromiseBase.node.ptr);
  uVar3 = (*pCVar7->_vptr_ConnectionReceiver[1])();
  pcVar8 = (char *)(ulong)uVar3;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar2))
            (&local_128,(undefined8 *)CONCAT44(extraout_var_00,iVar2),connection.ptr);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&local_118,&local_128);
  kj::Own<kj::NetworkAddress>::operator=((Own<kj::NetworkAddress> *)local_c8,&local_118);
  kj::Own<kj::NetworkAddress>::~Own(&local_118);
  kj::Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_128);
  pNVar5 = kj::Own<kj::NetworkAddress>::operator->((Own<kj::NetworkAddress> *)local_c8);
  (**pNVar5->_vptr_NetworkAddress)(&client.rpcSystem.super_RpcSystemBase.impl.ptr);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)local_148,
             &client.rpcSystem.super_RpcSystemBase.impl.ptr);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)&client.rpcSystem.super_RpcSystemBase.impl.ptr)
  ;
  connection_00 = kj::Own<kj::AsyncIoStream>::operator*((Own<kj::AsyncIoStream> *)local_148);
  TwoPartyClient::TwoPartyClient((TwoPartyClient *)&cap.field_0x10,connection_00);
  TwoPartyClient::bootstrap((TwoPartyClient *)&request.hook.ptr);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_300,(Client *)&request.hook.ptr);
  Capability::Client::~Client((Client *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_360,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_348,(Client *)local_300,(Maybe<capnp::MessageSize> *)local_360);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_360);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_348,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_348,true);
  iVar2 = (int)pcVar8;
  __buf = extraout_RDX;
  if (server.tasks.emptyFulfiller.ptr.ptr._4_4_ != 0) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    __buf = extraout_RDX_00;
    while (iVar2 = (int)pcVar8, (bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      local_130 = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
      pcVar8 = "failed: expected (0) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x14e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response.hook.ptr,
                 (int *)((long)&server.tasks.emptyFulfiller.ptr.ptr + 4));
      __buf = extraout_RDX_01;
      response.hook.ptr._7_1_ = false;
    }
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_3e0,(int)local_348,__buf,(size_t)local_130,iVar2);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_3a8,&local_3e0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_3e0);
  _auStack_3f0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_3a8);
  bVar1 = kj::operator==("foo",(StringPtr *)auStack_3f0);
  if (!bVar1) {
    local_3f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f1 != false) {
      AVar9 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_3a8);
      _auStack_408 = AVar9;
      kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x150,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
                 (char (*) [4])0xa4c8db,(Reader *)auStack_408);
      local_3f1 = false;
    }
  }
  if (server.tasks.emptyFulfiller.ptr.ptr._4_4_ != 1) {
    local_409 = kj::_::Debug::shouldLog(ERROR);
    while (local_409 != false) {
      local_410 = 1;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x151,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",&local_410,
                 (int *)((long)&server.tasks.emptyFulfiller.ptr.ptr + 4));
      local_409 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_3a8);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_348);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_300);
  TwoPartyClient::~TwoPartyClient((TwoPartyClient *)&cap.field_0x10);
  kj::Own<kj::AsyncIoStream>::~Own((Own<kj::AsyncIoStream> *)local_148);
  kj::Promise<void>::~Promise((Promise<void> *)local_108);
  kj::Own<kj::ConnectionReceiver>::~Own
            ((Own<kj::ConnectionReceiver> *)&listenPromise.super_PromiseBase.node.ptr);
  kj::Own<kj::NetworkAddress>::~Own((Own<kj::NetworkAddress> *)local_c8);
  TwoPartyServer::~TwoPartyServer((TwoPartyServer *)local_88);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)local_40);
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}